

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::EnhancedLayouts::Utils::GetDefinitions_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,PtrVector *vector,FLAVOUR flavour)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  size_t position;
  size_t local_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"LIST","");
  local_58 = 0;
  lVar2 = *(long *)this;
  if (*(long *)(this + 8) != lVar2) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      lVar2 = *(long *)(lVar2 + uVar3 * 8);
      Variable::Descriptor::GetDefinition_abi_cxx11_
                (&local_50,(Descriptor *)(lVar2 + 0x10),(FLAVOUR)vector,*(STORAGE *)(lVar2 + 0x80));
      insertElementOfList(local_50._M_dataplus._M_p,"\n",&local_58,__return_storage_ptr__);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar2 = *(long *)this;
      bVar1 = uVar4 < (ulong)(*(long *)(this + 8) - lVar2 >> 3);
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar1);
  }
  endList(::glcts::fixed_sample_locations_values + 1,&local_58,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GetDefinitions(const Variable::PtrVector& vector, Variable::FLAVOUR flavour)
{
	std::string list	 = Utils::g_list;
	size_t		position = 0;

	for (GLuint i = 0; i < vector.size(); ++i)
	{
		Utils::insertElementOfList(vector[i]->GetDefinition(flavour).c_str(), "\n", position, list);
	}

	Utils::endList("", position, list);

	return list;
}